

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  undefined1 auVar1 [16];
  byte bVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  long lVar6;
  size_t code;
  ulong in_RCX;
  uint *in_RDX;
  uint in_ESI;
  short *in_RDI;
  uint in_R8D;
  size_t errorCode;
  U64 restToBeat;
  short proba;
  U32 lowThreshold;
  short largestP;
  uint largest;
  uint s;
  int stillToDistribute;
  U64 vStep;
  U64 step;
  U64 scale;
  undefined8 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined4 in_stack_ffffffffffffffa4;
  short local_56;
  uint local_54;
  uint local_50;
  int local_4c;
  uint local_14;
  ulong local_8;
  
  local_14 = in_ESI;
  if (in_ESI == 0) {
    local_14 = 0xb;
  }
  if (local_14 < 5) {
    local_8 = 0xffffffffffffffff;
  }
  else if (local_14 < 0xd) {
    uVar5 = FSE_minTableLog(CONCAT44(in_stack_ffffffffffffffa4,
                                     CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                            (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (local_14 < uVar5) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      bVar3 = (byte)local_14;
      bVar2 = -bVar3 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RCX;
      lVar6 = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
      local_4c = 1 << (bVar3 & 0x1f);
      local_54 = 0;
      local_56 = 0;
      for (local_50 = 0; local_50 <= in_R8D; local_50 = local_50 + 1) {
        if (in_RDX[local_50] == in_RCX) {
          return 0;
        }
        if (in_RDX[local_50] == 0) {
          in_RDI[local_50] = 0;
        }
        else if ((uint)(in_RCX >> (bVar3 & 0x3f)) < in_RDX[local_50]) {
          sVar4 = (short)((ulong)in_RDX[local_50] * lVar6 >> (bVar2 & 0x3f));
          if (sVar4 < 8) {
            sVar4 = sVar4 + (ushort)((1L << (-bVar3 + 0x2a & 0x3f)) *
                                     (ulong)FSE_normalizeCount::rtbTable[sVar4] <
                                    (ulong)in_RDX[local_50] * lVar6 -
                                    ((long)sVar4 << (bVar2 & 0x3f)));
          }
          if (local_56 < sVar4) {
            local_54 = local_50;
            local_56 = sVar4;
          }
          in_RDI[local_50] = sVar4;
          local_4c = local_4c - sVar4;
        }
        else {
          in_RDI[local_50] = -1;
          local_4c = local_4c + -1;
        }
      }
      if (-local_4c < (int)in_RDI[local_54] >> 1) {
        in_RDI[local_54] = in_RDI[local_54] + (short)local_4c;
      }
      else {
        code = FSE_normalizeM2(in_RDI,local_14,in_RDX,in_RCX,in_R8D);
        uVar5 = ERR_isError(code);
        if (uVar5 != 0) {
          return code;
        }
      }
      local_8 = (ulong)local_14;
    }
  }
  else {
    local_8 = 0xffffffffffffffd4;
  }
  return local_8;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            printf("%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            printf("Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}